

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall
despot::util::tinyxml::TiXmlHandle::ChildElement(TiXmlHandle *this,char *value,int count)

{
  TiXmlElement *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  int iVar1;
  
  if (*(TiXmlNode **)value != (TiXmlNode *)0x0) {
    this_00 = TiXmlNode::FirstChildElement
                        (*(TiXmlNode **)value,(char *)CONCAT44(in_register_00000014,count));
    for (iVar1 = 0; (this_00 != (TiXmlElement *)0x0 && (iVar1 < in_ECX)); iVar1 = iVar1 + 1) {
      this_00 = TiXmlNode::NextSiblingElement
                          (&this_00->super_TiXmlNode,(char *)CONCAT44(in_register_00000014,count));
    }
    if (this_00 != (TiXmlElement *)0x0) goto LAB_00178f73;
  }
  this_00 = (TiXmlElement *)0x0;
LAB_00178f73:
  this->node = &this_00->super_TiXmlNode;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement(const char* value, int count) const {
	if (node) {
		int i;
		TiXmlElement* child = node->FirstChildElement(value);
		for (i = 0; child && i < count;
			child = child->NextSiblingElement(value), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}